

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void __thiscall OjaNewton::check(OjaNewton *this)

{
  uint uVar1;
  float **ppfVar2;
  int i;
  uint uVar3;
  long lVar4;
  long lVar5;
  weight *pwVar6;
  int h;
  long lVar7;
  int iVar8;
  int j;
  ulong uVar9;
  int h_2;
  int j_1;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  uint32_t i_2;
  size_t sVar13;
  ulong uVar14;
  double __x;
  
  uVar1 = this->m;
  uVar14 = (ulong)uVar1;
  ppfVar2 = this->K;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  __x = 0.0;
  for (uVar12 = 1; uVar9 = uVar12, uVar12 != uVar3 + 1; uVar12 = uVar12 + 1) {
    for (; uVar1 + 1 != uVar9; uVar9 = uVar9 + 1) {
      __x = fmax(__x,(double)ABS(ppfVar2[uVar12][uVar9]));
    }
  }
  if (10000000.0 <= __x) {
    lVar7 = 1;
    for (lVar10 = lVar7; lVar10 <= (int)uVar14; lVar10 = lVar10 + 1) {
      memset(this->tmp,0,(long)(int)uVar14 * 8 + 8);
      uVar14 = (ulong)(uint)this->m;
      for (lVar4 = lVar7; lVar5 = lVar7, lVar4 <= (int)uVar14; lVar4 = lVar4 + 1) {
        for (; lVar5 <= (int)uVar14; lVar5 = lVar5 + 1) {
          this->tmp[lVar4] = this->A[lVar4][lVar5] * this->K[lVar5][lVar10] + this->tmp[lVar4];
          uVar14 = (ulong)(uint)this->m;
        }
      }
      for (; lVar5 <= (int)uVar14; lVar5 = lVar5 + 1) {
        this->K[lVar5][lVar10] = this->tmp[lVar5];
        uVar14 = (ulong)(uint)this->m;
      }
    }
    lVar7 = 1;
    for (lVar10 = lVar7; lVar10 <= (int)uVar14; lVar10 = lVar10 + 1) {
      memset(this->tmp,0,(long)(int)uVar14 * 8 + 8);
      uVar14 = (ulong)(uint)this->m;
      for (lVar4 = lVar7; lVar5 = lVar7, lVar4 <= (int)uVar14; lVar4 = lVar4 + 1) {
        for (; lVar5 <= (int)uVar14; lVar5 = lVar5 + 1) {
          this->tmp[lVar4] = this->K[lVar10][lVar5] * this->A[lVar4][lVar5] + this->tmp[lVar4];
          uVar14 = (ulong)(uint)this->m;
        }
      }
      for (; lVar5 <= (int)uVar14; lVar5 = lVar5 + 1) {
        this->K[lVar10][lVar5] = this->tmp[lVar5];
        uVar14 = (ulong)(uint)this->m;
      }
    }
    sVar11 = 1L << ((byte)this->all->num_bits & 0x3f);
    for (sVar13 = 0; sVar13 != sVar11; sVar13 = sVar13 + 1) {
      pwVar6 = parameters::strided_index(&this->all->weights,sVar13);
      for (lVar7 = 1; uVar14 = (ulong)this->m, lVar7 <= (long)uVar14; lVar7 = lVar7 + 1) {
        *pwVar6 = pwVar6[lVar7] * this->b[lVar7] * this->D[lVar7] + *pwVar6;
      }
    }
    memset(this->b,0,(long)(int)uVar14 * 8 + 8);
    lVar7 = 1;
    for (sVar13 = 0; sVar13 != sVar11; sVar13 = sVar13 + 1) {
      memset(this->tmp,0,(long)this->m * 4 + 4);
      pwVar6 = parameters::strided_index(&this->all->weights,sVar13);
      iVar8 = this->m;
      for (lVar10 = lVar7; lVar4 = lVar7, lVar10 <= iVar8; lVar10 = lVar10 + 1) {
        for (; lVar4 <= iVar8; lVar4 = lVar4 + 1) {
          this->tmp[lVar10] =
               this->A[lVar10][lVar4] * this->D[lVar4] * pwVar6[lVar4] + this->tmp[lVar10];
          iVar8 = this->m;
        }
      }
      for (; lVar4 <= iVar8; lVar4 = lVar4 + 1) {
        pwVar6[lVar4] = this->tmp[lVar4];
        iVar8 = this->m;
      }
    }
    for (lVar7 = 1; lVar7 <= this->m; lVar7 = lVar7 + 1) {
      memset(this->A[lVar7],0,(long)this->m * 8 + 8);
      this->D[lVar7] = 1.0;
      this->A[lVar7][lVar7] = 1.0;
    }
  }
  return;
}

Assistant:

void check()
  {
    double max_norm = 0;
    for (int i = 1; i <= m; i++)
      for (int j = i; j <= m; j++) max_norm = fmax(max_norm, fabs(K[i][j]));
    // printf("|K| = %f\n", max_norm);
    if (max_norm < 1e7)
      return;

    // implicit -> explicit representation
    // printf("begin conversion: t = %d, norm(K) = %f\n", t, max_norm);

    // first step: K <- AKA'

    // K <- AK
    for (int j = 1; j <= m; j++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int i = 1; i <= m; i++)
      {
        for (int h = 1; h <= m; h++)
        {
          tmp[i] += A[i][h] * K[h][j];
        }
      }

      for (int i = 1; i <= m; i++) K[i][j] = tmp[i];
    }
    // K <- KA'
    for (int i = 1; i <= m; i++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int j = 1; j <= m; j++)
        for (int h = 1; h <= m; h++) tmp[j] += K[i][h] * A[j][h];

      for (int j = 1; j <= m; j++)
      {
        K[i][j] = tmp[j];
      }
    }

    // second step: w[0] <- w[0] + (DZ)'b, b <- 0.

    uint32_t length = 1 << all->num_bits;
    for (uint32_t i = 0; i < length; i++)
    {
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++) w += (&w)[j] * b[j] * D[j];
    }

    memset(b, 0, sizeof(double) * (m + 1));

    // third step: Z <- ADZ, A, D <- Identity

    // double norm = 0;
    for (uint32_t i = 0; i < length; ++i)
    {
      memset(tmp, 0, sizeof(float) * (m + 1));
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++)
      {
        for (int h = 1; h <= m; ++h) tmp[j] += A[j][h] * D[h] * (&w)[h];
      }
      for (int j = 1; j <= m; ++j)
      {
        // norm = max(norm, fabs(tmp[j]));
        (&w)[j] = tmp[j];
      }
    }
    // printf("|Z| = %f\n", norm);

    for (int i = 1; i <= m; i++)
    {
      memset(A[i], 0, sizeof(double) * (m + 1));
      D[i] = 1;
      A[i][i] = 1;
    }
  }